

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O0

void ibfR2(float *ioptr,long M,long NDiffU)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ulong in_RDX;
  byte in_SIL;
  float *in_RDI;
  unsigned_long pnext;
  unsigned_long pinc;
  unsigned_long posi;
  unsigned_long pos;
  float Two;
  float f7i;
  float f7r;
  float f6i;
  float f6r;
  float f5i;
  float f5r;
  float f4i;
  float f4r;
  float f3i;
  float f3r;
  float f2i;
  float f2r;
  float f1i;
  float f1r;
  float f0i;
  float f0r;
  float *p3r;
  float *p2r;
  float *p1r;
  float *p0r;
  float *pstrt;
  unsigned_long SameUCnt;
  unsigned_long NSameU;
  
  _f4i = in_RDI + in_RDX * 2;
  _f5i = _f4i + in_RDX * 2;
  _f6i = _f5i + in_RDX * 2;
  _f3i = in_RDI;
  for (_f1i = ((ulong)(1L << (in_SIL & 0x3f)) >> 2) / in_RDX; _f1i != 0; _f1i = _f1i - 1) {
    fVar1 = *_f3i;
    fVar2 = *_f4i;
    fVar3 = _f3i[1];
    fVar4 = _f4i[1];
    fVar5 = *_f5i;
    fVar6 = *_f6i;
    fVar7 = _f5i[1];
    fVar8 = _f6i[1];
    *_f3i = fVar1 + fVar2;
    _f3i[1] = fVar3 + fVar4;
    *_f4i = fVar1 - fVar2;
    _f4i[1] = fVar3 - fVar4;
    *_f5i = fVar5 + fVar6;
    _f5i[1] = fVar7 + fVar8;
    *_f6i = fVar5 - fVar6;
    _f6i[1] = fVar7 - fVar8;
    fVar1 = _f3i[2];
    fVar2 = _f4i[3];
    fVar3 = _f3i[3];
    fVar4 = _f4i[2];
    fVar5 = _f5i[2];
    fVar6 = _f6i[3];
    fVar7 = _f5i[3];
    fVar8 = _f6i[2];
    _f3i[2] = fVar1 - fVar2;
    _f3i[3] = fVar3 + fVar4;
    _f4i[2] = fVar1 + fVar2;
    _f4i[3] = fVar3 - fVar4;
    _f5i[2] = fVar5 - fVar6;
    _f5i[3] = fVar7 + fVar8;
    _f6i[2] = fVar5 + fVar6;
    _f6i[3] = fVar7 - fVar8;
    _f3i = _f3i + in_RDX * 8;
    _f4i = _f4i + in_RDX * 8;
    _f5i = _f5i + in_RDX * 8;
    _f6i = _f6i + in_RDX * 8;
  }
  return;
}

Assistant:

static inline void ibfR2(float *ioptr, long M, long NDiffU){
/*** 2nd radix 2 stage ***/
unsigned long	pos;
unsigned long	posi;
unsigned long	pinc;
unsigned long	pnext;
unsigned long 	NSameU;
unsigned long 	SameUCnt;

float	*pstrt;
float 	*p0r, *p1r, *p2r, *p3r;

float f0r, f0i, f1r, f1i, f2r, f2i, f3r, f3i;
float f4r, f4i, f5r, f5i, f6r, f6i, f7r, f7i;
const float Two = 2.0;

pinc = NDiffU * 2;		// 2 floats per complex
pnext =  pinc * 4;
pos = 2;
posi = pos+1;
NSameU = POW2(M) / 4 /NDiffU;	// 4 Us at a time
pstrt = ioptr;
p0r = pstrt;
p1r = pstrt+pinc;
p2r = p1r+pinc;
p3r = p2r+pinc;

		/* Butterflys		*/
		/*
		f0	-	-	f4
		f1	-  1 -	f5
		f2	-	-	f6
		f3	-  1 -	f7
		*/
		/* Butterflys		*/
		/*
		f0	-	-	f4
		f1	-  1 -	f5
		f2	-	-	f6
		f3	-  1 -	f7
		*/

for (SameUCnt = NSameU; SameUCnt > 0 ; SameUCnt--){

	f0r = *p0r;
	f1r = *p1r;
	f0i = *(p0r + 1);
	f1i = *(p1r + 1);
	f2r = *p2r;
	f3r = *p3r;
	f2i = *(p2r + 1);
	f3i = *(p3r + 1);

	f4r = f0r + f1r;
	f4i = f0i + f1i;
	f5r = f0r - f1r;
	f5i = f0i - f1i;

	f6r = f2r + f3r;
	f6i = f2i + f3i;
	f7r = f2r - f3r;
	f7i = f2i - f3i;

	*p0r = f4r;
	*(p0r + 1) = f4i;
	*p1r = f5r;
	*(p1r + 1) = f5i;
	*p2r = f6r;
	*(p2r + 1) = f6i;
	*p3r = f7r;
	*(p3r + 1) = f7i;

	f0r = *(p0r + pos);
	f1i = *(p1r + posi);
	f0i = *(p0r + posi);
	f1r = *(p1r + pos);
	f2r = *(p2r + pos);
	f3i = *(p3r + posi);
	f2i = *(p2r + posi);
	f3r = *(p3r + pos);

	f4r = f0r - f1i;
	f4i = f0i + f1r;
	f5r = f0r + f1i;
	f5i = f0i - f1r;

	f6r = f2r - f3i;
	f6i = f2i + f3r;
	f7r = f2r + f3i;
	f7i = f2i - f3r;

	*(p0r + pos) = f4r;
	*(p0r + posi) = f4i;
	*(p1r + pos) = f5r;
	*(p1r + posi) = f5i;
	*(p2r + pos) = f6r;
	*(p2r + posi) = f6i;
	*(p3r + pos) = f7r;
	*(p3r + posi) = f7i;

	p0r += pnext;
	p1r += pnext;
	p2r += pnext;
	p3r += pnext;

}
}